

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.cpp
# Opt level: O0

int duckdb_brotli::BrotliSafeReadBits32Slow(BrotliBitReader *br,uint64_t n_bits,uint64_t *val)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint8_t *puVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  uint8_t *local_1e8;
  ulong local_1a0;
  ulong local_198;
  BrotliBitReaderState memento;
  uint64_t high_val;
  uint64_t low_val;
  uint64_t *val_local;
  uint64_t n_bits_local;
  BrotliBitReader *br_local;
  
  uVar1 = br->val_;
  uVar2 = br->bit_pos_;
  puVar3 = br->next_in;
  lVar6 = (long)br->last_in - (long)br->next_in;
  while (br->bit_pos_ < 0x10) {
    if (br->next_in == br->last_in) {
      bVar4 = false;
      goto LAB_023f8c8f;
    }
    br->val_ = br->val_ | (ulong)*br->next_in << ((byte)br->bit_pos_ & 0x3f);
    br->bit_pos_ = br->bit_pos_ + 8;
    br->next_in = br->next_in + 1;
  }
  local_198 = br->val_ & 0xffff;
  br->bit_pos_ = br->bit_pos_ - 0x10;
  br->val_ = br->val_ >> 0x10;
  bVar4 = true;
LAB_023f8c8f:
  if (bVar4) {
    uVar5 = n_bits - 0x10;
    while (br->bit_pos_ < uVar5) {
      if (br->next_in == br->last_in) {
        bVar4 = false;
        goto LAB_023f8ea4;
      }
      br->val_ = br->val_ | (ulong)*br->next_in << ((byte)br->bit_pos_ & 0x3f);
      br->bit_pos_ = br->bit_pos_ + 8;
      br->next_in = br->next_in + 1;
    }
    local_1a0 = br->val_ & *(ulong *)(kBrotliBitMask + uVar5 * 8);
    br->bit_pos_ = br->bit_pos_ - uVar5;
    br->val_ = br->val_ >> ((byte)uVar5 & 0x3f);
    bVar4 = true;
LAB_023f8ea4:
    if (bVar4) {
      *val = local_198 | local_1a0 << 0x10;
      return 1;
    }
  }
  br->val_ = uVar1;
  br->bit_pos_ = uVar2;
  br->next_in = puVar3;
  br->next_in = puVar3;
  local_1e8 = puVar3;
  if (lVar6 != 0) {
    local_1e8 = puVar3 + lVar6;
  }
  br->last_in = local_1e8;
  if (lVar6 + 1U < 0x1d) {
    br->guard_in = puVar3;
  }
  else {
    br->guard_in = puVar3 + lVar6 + -0x1b;
  }
  return 0;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliSafeReadBits32Slow(BrotliBitReader* const br,
    brotli_reg_t n_bits, brotli_reg_t* val) {
  brotli_reg_t low_val;
  brotli_reg_t high_val;
  BrotliBitReaderState memento;
  BROTLI_DCHECK(n_bits <= 32);
  BROTLI_DCHECK(n_bits > 24);
  BrotliBitReaderSaveState(br, &memento);
  if (!BrotliSafeReadBits(br, 16, &low_val) ||
      !BrotliSafeReadBits(br, n_bits - 16, &high_val)) {
    BrotliBitReaderRestoreState(br, &memento);
    return BROTLI_FALSE;
  }
  *val = low_val | (high_val << 16);
  return BROTLI_TRUE;
}